

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void __thiscall
cmsys::SystemInformationImplementation::FindManufacturer
          (SystemInformationImplementation *this,string *family)

{
  bool bVar1;
  int iVar2;
  string *family_local;
  SystemInformationImplementation *this_local;
  
  bVar1 = std::operator==(&(this->ChipID).Vendor,"GenuineIntel");
  if (bVar1) {
    this->ChipManufacturer = Intel;
  }
  else {
    bVar1 = std::operator==(&(this->ChipID).Vendor,"UMC UMC UMC ");
    if (bVar1) {
      this->ChipManufacturer = UMC;
    }
    else {
      bVar1 = std::operator==(&(this->ChipID).Vendor,"AuthenticAMD");
      if (bVar1) {
        this->ChipManufacturer = AMD;
      }
      else {
        bVar1 = std::operator==(&(this->ChipID).Vendor,"AMD ISBETTER");
        if (bVar1) {
          this->ChipManufacturer = AMD;
        }
        else {
          bVar1 = std::operator==(&(this->ChipID).Vendor,"HygonGenuine");
          if (bVar1) {
            this->ChipManufacturer = Hygon;
          }
          else {
            bVar1 = std::operator==(&(this->ChipID).Vendor,"CyrixInstead");
            if (bVar1) {
              this->ChipManufacturer = Cyrix;
            }
            else {
              bVar1 = std::operator==(&(this->ChipID).Vendor,"NexGenDriven");
              if (bVar1) {
                this->ChipManufacturer = NexGen;
              }
              else {
                bVar1 = std::operator==(&(this->ChipID).Vendor,"CentaurHauls");
                if (bVar1) {
                  this->ChipManufacturer = IDT;
                }
                else {
                  bVar1 = std::operator==(&(this->ChipID).Vendor,"  Shanghai  ");
                  if (bVar1) {
                    this->ChipManufacturer = Zhaoxin;
                  }
                  else {
                    bVar1 = std::operator==(&(this->ChipID).Vendor,"RiseRiseRise");
                    if (bVar1) {
                      this->ChipManufacturer = Rise;
                    }
                    else {
                      bVar1 = std::operator==(&(this->ChipID).Vendor,"GenuineTMx86");
                      if (bVar1) {
                        this->ChipManufacturer = Transmeta;
                      }
                      else {
                        bVar1 = std::operator==(&(this->ChipID).Vendor,"TransmetaCPU");
                        if (bVar1) {
                          this->ChipManufacturer = Transmeta;
                        }
                        else {
                          bVar1 = std::operator==(&(this->ChipID).Vendor,"Geode By NSC");
                          if (bVar1) {
                            this->ChipManufacturer = NSC;
                          }
                          else {
                            bVar1 = std::operator==(&(this->ChipID).Vendor,"Sun");
                            if (bVar1) {
                              this->ChipManufacturer = Sun;
                            }
                            else {
                              bVar1 = std::operator==(&(this->ChipID).Vendor,"IBM");
                              if (bVar1) {
                                this->ChipManufacturer = IBM;
                              }
                              else {
                                bVar1 = std::operator==(&(this->ChipID).Vendor,"Hewlett-Packard");
                                if (bVar1) {
                                  this->ChipManufacturer = HP;
                                }
                                else {
                                  bVar1 = std::operator==(&(this->ChipID).Vendor,"Motorola");
                                  if (bVar1) {
                                    this->ChipManufacturer = Motorola;
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare
                                                      ((ulong)family,0,(char *)0x7);
                                    if (iVar2 == 0) {
                                      this->ChipManufacturer = HP;
                                    }
                                    else {
                                      bVar1 = std::operator==(&(this->ChipID).Vendor,"Apple");
                                      if (bVar1) {
                                        this->ChipManufacturer = Apple;
                                      }
                                      else {
                                        this->ChipManufacturer = UnknownManufacturer;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SystemInformationImplementation::FindManufacturer(
  const std::string& family)
{
  if (this->ChipID.Vendor == "GenuineIntel")
    this->ChipManufacturer = Intel; // Intel Corp.
  else if (this->ChipID.Vendor == "UMC UMC UMC ")
    this->ChipManufacturer = UMC; // United Microelectronics Corp.
  else if (this->ChipID.Vendor == "AuthenticAMD")
    this->ChipManufacturer = AMD; // Advanced Micro Devices
  else if (this->ChipID.Vendor == "AMD ISBETTER")
    this->ChipManufacturer = AMD; // Advanced Micro Devices (1994)
  else if (this->ChipID.Vendor == "HygonGenuine")
    this->ChipManufacturer = Hygon; // Chengdu Haiguang IC Design Co., Ltd.
  else if (this->ChipID.Vendor == "CyrixInstead")
    this->ChipManufacturer = Cyrix; // Cyrix Corp., VIA Inc.
  else if (this->ChipID.Vendor == "NexGenDriven")
    this->ChipManufacturer = NexGen; // NexGen Inc. (now AMD)
  else if (this->ChipID.Vendor == "CentaurHauls")
    this->ChipManufacturer = IDT; // original IDT/Centaur/VIA (now Zhaoxin)
  else if (this->ChipID.Vendor == "  Shanghai  ")
    this->ChipManufacturer =
      Zhaoxin; // Shanghai Zhaoxin Semiconductor Co., Ltd.
  else if (this->ChipID.Vendor == "RiseRiseRise")
    this->ChipManufacturer = Rise; // Rise
  else if (this->ChipID.Vendor == "GenuineTMx86")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "TransmetaCPU")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "Geode By NSC")
    this->ChipManufacturer = NSC; // National Semiconductor
  else if (this->ChipID.Vendor == "Sun")
    this->ChipManufacturer = Sun; // Sun Microelectronics
  else if (this->ChipID.Vendor == "IBM")
    this->ChipManufacturer = IBM; // IBM Microelectronics
  else if (this->ChipID.Vendor == "Hewlett-Packard")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Motorola")
    this->ChipManufacturer = Motorola; // Motorola Microelectronics
  else if (family.compare(0, 7, "PA-RISC") == 0)
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Apple")
    this->ChipManufacturer = Apple; // Apple
  else
    this->ChipManufacturer = UnknownManufacturer; // Unknown manufacturer
}